

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utBlendImportAreaLight.cpp
# Opt level: O0

void __thiscall
BlendImportAreaLight_testImportLight_Test::TestBody(BlendImportAreaLight_testImportLight_Test *this)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  iterator __first;
  reference pvVar4;
  reference pvVar5;
  char *in_R9;
  pair<const_char_*,_unsigned_long> pVar6;
  AssertHelper local_428;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_21;
  Message local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_20;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_19;
  Message local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_18;
  Message local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_17;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_16;
  Message local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_15;
  Message local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_14;
  Message local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_13;
  Message local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_12;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_11;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_10;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_9;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_8;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_7;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_6;
  Message local_220;
  aiLightSourceType local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_5;
  Message local_1f8;
  aiLightSourceType local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_4;
  Message local_1d0;
  aiLightSourceType local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_3;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  size_t i_1;
  vector<aiLight,_std::allocator<aiLight>_> lights;
  char *local_120;
  pair<const_char_*,_unsigned_long> local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_108;
  unsigned_long local_e0;
  size_t i;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  lightNames;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  string local_70;
  AssertHelper local_50;
  Message local_48 [3];
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  aiScene *pTest;
  BlendImportAreaLight_testImportLight_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Assimp::Importer::ReadFile
                 ((this->super_BlendImportAreaLight).im,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/BLEND/AreaLight_269.blend"
                  ,0x400);
  local_29 = (aiScene *)gtest_ar_.message_.ptr_ != (aiScene *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_28,(AssertionResult *)"pTest != NULL","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(local_48);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    local_89 = aiScene::HasLights((aiScene *)gtest_ar_.message_.ptr_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_88,&local_89,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar2) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &lightNames.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_88,
                 (AssertionResult *)"pTest->HasLights()","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                 ,0x4a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string
                ((string *)
                 &lightNames.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_98);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)&i);
      for (local_e0 = 0; local_e0 < *(uint *)&gtest_ar_.message_.ptr_[2].field_2;
          local_e0 = local_e0 + 1) {
        local_120 = aiString::C_Str(*(aiString **)
                                     (*(long *)((long)&gtest_ar_.message_.ptr_[2].field_2 + 8) +
                                     local_e0 * 8));
        pVar6 = std::make_pair<char_const*,unsigned_long&>(&local_120,&local_e0);
        local_118 = pVar6;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair<const_char_*,_unsigned_long,_true>(&local_108,&local_118);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)&i,&local_108);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::~pair(&local_108);
      }
      __first = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)&i);
      lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)&i);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>>
                ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                  )lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      std::vector<aiLight,_std::allocator<aiLight>_>::vector
                ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1);
      for (gtest_ar.message_.ptr_ =
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar.message_.ptr_ <
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (ulong)*(uint *)&gtest_ar_.message_.ptr_[2].field_2;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(gtest_ar.message_.ptr_)->field_0x1) {
        lVar1 = *(long *)((long)&gtest_ar_.message_.ptr_[2].field_2 + 8);
        pvVar4 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)&i,(size_type)gtest_ar.message_.ptr_);
        std::vector<aiLight,_std::allocator<aiLight>_>::push_back
                  ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,
                   *(value_type **)(lVar1 + pvVar4->second * 8));
      }
      pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                         ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
      pcVar3 = aiString::C_Str(&pvVar5->mName);
      testing::internal::CmpHelperSTREQ
                ((internal *)local_160,"lights[0].mName.C_Str()","\"Bar\"",pcVar3,"Bar");
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar2) {
        testing::Message::Message(&local_168);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                   ,0x5a,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_168);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_168);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                           ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,1);
        pcVar3 = aiString::C_Str(&pvVar5->mName);
        testing::internal::CmpHelperSTREQ
                  ((internal *)local_180,"lights[1].mName.C_Str()","\"Baz\"",pcVar3,"Baz");
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
        if (!bVar2) {
          testing::Message::Message(&local_188);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                     ,0x5b,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_188);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_188);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                             ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
          pcVar3 = aiString::C_Str(&pvVar5->mName);
          testing::internal::CmpHelperSTREQ
                    ((internal *)local_1a0,"lights[2].mName.C_Str()","\"Foo\"",pcVar3,"Foo");
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
          if (!bVar2) {
            testing::Message::Message(&local_1a8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                       ,0x5c,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_1a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_1a8);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                               ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
            local_1c4 = aiLightSource_AREA;
            testing::internal::EqHelper<false>::Compare<aiLightSourceType,aiLightSourceType>
                      ((EqHelper<false> *)local_1c0,"lights[0].mType","aiLightSource_AREA",
                       &pvVar5->mType,&local_1c4);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
            if (!bVar2) {
              testing::Message::Message(&local_1d0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                         ,0x5e,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_1d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_1d0);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                 ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,1);
              local_1ec = aiLightSource_POINT;
              testing::internal::EqHelper<false>::Compare<aiLightSourceType,aiLightSourceType>
                        ((EqHelper<false> *)local_1e8,"lights[1].mType","aiLightSource_POINT",
                         &pvVar5->mType,&local_1ec);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
              if (!bVar2) {
                testing::Message::Message(&local_1f8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x5f,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_1f8);
              }
              gtest_ar__1.message_.ptr_._5_3_ = 0;
              gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                   ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                local_214 = aiLightSource_AREA;
                testing::internal::EqHelper<false>::Compare<aiLightSourceType,aiLightSourceType>
                          ((EqHelper<false> *)local_210,"lights[2].mType","aiLightSource_AREA",
                           &pvVar5->mType,&local_214);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_210);
                if (!bVar2) {
                  testing::Message::Message(&local_220);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                             ,0x60,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_6.message_,&local_220);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_6.message_);
                  testing::Message::~Message(&local_220);
                }
                gtest_ar__1.message_.ptr_._5_3_ = 0;
                gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_238,"lights[0].mSize.x","0.5f",(pvVar5->mSize).x,0.5)
                  ;
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_238);
                  if (!bVar2) {
                    testing::Message::Message(&local_240);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x62,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_7.message_,&local_240);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_7.message_);
                    testing::Message::~Message(&local_240);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_258,"lights[0].mSize.y","2.0f",(pvVar5->mSize).y,2.0)
                  ;
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_258);
                  if (!bVar2) {
                    testing::Message::Message(&local_260);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,99,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_8.message_,&local_260);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_);
                    testing::Message::~Message(&local_260);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_278,"lights[2].mSize.x","1.0f",(pvVar5->mSize).x,1.0)
                  ;
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_278);
                  if (!bVar2) {
                    testing::Message::Message(&local_280);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,100,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_280);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_280);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_298,"lights[2].mSize.y","1.0f",(pvVar5->mSize).y,1.0)
                  ;
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_298);
                  if (!bVar2) {
                    testing::Message::Message(&local_2a0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x65,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_10.message_,&local_2a0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_10.message_);
                    testing::Message::~Message(&local_2a0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_2b8,"lights[0].mColorDiffuse.r","42.0f",
                             (pvVar5->mColorDiffuse).r,42.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2b8);
                  if (!bVar2) {
                    testing::Message::Message(&local_2c0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x67,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_11.message_,&local_2c0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_11.message_);
                    testing::Message::~Message(&local_2c0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_2d8,"lights[0].mColorDiffuse.g","42.0f",
                             (pvVar5->mColorDiffuse).g,42.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2d8);
                  if (!bVar2) {
                    testing::Message::Message(&local_2e0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x68,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_12.message_,&local_2e0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_12.message_);
                    testing::Message::~Message(&local_2e0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_2f8,"lights[0].mColorDiffuse.b","42.0f",
                             (pvVar5->mColorDiffuse).b,42.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2f8);
                  if (!bVar2) {
                    testing::Message::Message(&local_300);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x69,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_13.message_,&local_300);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_13.message_);
                    testing::Message::~Message(&local_300);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_318,"lights[2].mColorDiffuse.r","1.0f",
                             (pvVar5->mColorDiffuse).r,1.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_318);
                  if (!bVar2) {
                    testing::Message::Message(&local_320);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6a,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_14.message_,&local_320);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_14.message_);
                    testing::Message::~Message(&local_320);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_338,"lights[2].mColorDiffuse.g","1.0f",
                             (pvVar5->mColorDiffuse).g,1.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_338);
                  if (!bVar2) {
                    testing::Message::Message(&local_340);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6b,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_15.message_,&local_340);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_15.message_);
                    testing::Message::~Message(&local_340);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_358,"lights[2].mColorDiffuse.b","1.0f",
                             (pvVar5->mColorDiffuse).b,1.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_358);
                  if (!bVar2) {
                    testing::Message::Message(&local_360);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6c,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_16.message_,&local_360);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_16.message_);
                    testing::Message::~Message(&local_360);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_378,"lights[0].mDirection.x","0.0f",
                             (pvVar5->mDirection).x,0.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_378);
                  if (!bVar2) {
                    testing::Message::Message(&local_380);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_378)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6e,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_17.message_,&local_380);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_17.message_);
                    testing::Message::~Message(&local_380);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_398,"lights[0].mDirection.y","0.0f",
                             (pvVar5->mDirection).y,0.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_398);
                  if (!bVar2) {
                    testing::Message::Message(&local_3a0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_398)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x6f,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_18.message_,&local_3a0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_18.message_);
                    testing::Message::~Message(&local_3a0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,0);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_3b8,"lights[0].mDirection.z","-1.0f",
                             (pvVar5->mDirection).z,-1.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3b8);
                  if (!bVar2) {
                    testing::Message::Message(&local_3c0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x70,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_19.message_,&local_3c0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_19.message_);
                    testing::Message::~Message(&local_3c0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_3d8,"lights[2].mDirection.x","0.0f",
                             (pvVar5->mDirection).x,0.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3d8);
                  if (!bVar2) {
                    testing::Message::Message(&local_3e0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x71,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_20.message_,&local_3e0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_20.message_);
                    testing::Message::~Message(&local_3e0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_3f8,"lights[2].mDirection.y","0.0f",
                             (pvVar5->mDirection).y,0.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3f8);
                  if (!bVar2) {
                    testing::Message::Message(&local_400);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x72,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_21.message_,&local_400);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_21.message_);
                    testing::Message::~Message(&local_400);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
                  pvVar5 = std::vector<aiLight,_std::allocator<aiLight>_>::operator[]
                                     ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1,2);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_418,"lights[2].mDirection.z","-1.0f",
                             (pvVar5->mDirection).z,-1.0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_418);
                  if (!bVar2) {
                    testing::Message::Message(&local_420);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_418)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_428,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                               ,0x73,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_428,&local_420);
                    testing::internal::AssertHelper::~AssertHelper(&local_428);
                    testing::Message::~Message(&local_420);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
                  gtest_ar__1.message_.ptr_._4_4_ = 0;
                }
              }
            }
          }
        }
      }
      std::vector<aiLight,_std::allocator<aiLight>_>::~vector
                ((vector<aiLight,_std::allocator<aiLight>_> *)&i_1);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)&i);
    }
  }
  return;
}

Assistant:

TEST_F(BlendImportAreaLight, testImportLight)
{
    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/BLEND/AreaLight_269.blend", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest != NULL);
    ASSERT_TRUE(pTest->HasLights());

    std::vector< std::pair<std::string, size_t> > lightNames;

    for (size_t i = 0; i < pTest->mNumLights; i++) {
        lightNames.push_back(std::make_pair(pTest->mLights[i]->mName.C_Str(), i));
    }

    std::sort(lightNames.begin(), lightNames.end());

    std::vector<aiLight> lights;

    for (size_t i = 0; i < pTest->mNumLights; ++i) {
        lights.push_back(*pTest->mLights[lightNames[i].second]);
    }

    ASSERT_STREQ(lights[0].mName.C_Str(), "Bar");
    ASSERT_STREQ(lights[1].mName.C_Str(), "Baz");
    ASSERT_STREQ(lights[2].mName.C_Str(), "Foo");

    ASSERT_EQ(lights[0].mType, aiLightSource_AREA);
    ASSERT_EQ(lights[1].mType, aiLightSource_POINT);
    ASSERT_EQ(lights[2].mType, aiLightSource_AREA);

    EXPECT_FLOAT_EQ(lights[0].mSize.x, 0.5f);
    EXPECT_FLOAT_EQ(lights[0].mSize.y, 2.0f);
    EXPECT_FLOAT_EQ(lights[2].mSize.x, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mSize.y, 1.0f);

    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.r, 42.0f);
    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.g, 42.0f);
    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.b, 42.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.r, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.g, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.b, 1.0f);

    EXPECT_FLOAT_EQ(lights[0].mDirection.x, 0.0f);
    EXPECT_FLOAT_EQ(lights[0].mDirection.y, 0.0f);
    EXPECT_FLOAT_EQ(lights[0].mDirection.z, -1.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.x, 0.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.y, 0.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.z, -1.0f);
}